

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewCDataBlock(xmlDocPtr doc,xmlChar *content,int len)

{
  _xmlDtd *p_Var1;
  xmlRegisterNodeFunc *pp_Var2;
  xmlNodePtr cur;
  int len_local;
  xmlChar *content_local;
  xmlDocPtr doc_local;
  
  doc_local = (xmlDocPtr)(*xmlMalloc)(0x78);
  if (doc_local == (xmlDocPtr)0x0) {
    xmlTreeErrMemory("building CDATA");
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    memset(doc_local,0,0x78);
    doc_local->type = XML_CDATA_SECTION_NODE;
    doc_local->doc = doc;
    if (content != (xmlChar *)0x0) {
      p_Var1 = (_xmlDtd *)xmlStrndup(content,len);
      doc_local->intSubset = p_Var1;
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var2 = __xmlRegisterNodeDefaultValue(), *pp_Var2 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var2 = __xmlRegisterNodeDefaultValue();
      (**pp_Var2)((xmlNodePtr)doc_local);
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlNewCDataBlock(xmlDocPtr doc, const xmlChar *content, int len) {
    xmlNodePtr cur;

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building CDATA");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_CDATA_SECTION_NODE;
    cur->doc = doc;

    if (content != NULL) {
	cur->content = xmlStrndup(content, len);
    }

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);
}